

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O1

void __thiscall YdiskRestClient::makeFolder(YdiskRestClient *this,string *utf8Path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 extraout_RAX;
  char *this_00;
  Client *this_01;
  string empty_body;
  shared_ptr<httplib::Response> r;
  string url;
  string local_68;
  undefined1 local_48 [16];
  Headers *local_38 [2];
  undefined8 local_28;
  
  this_00 = "/v1/disk/resources?path=";
  local_38[0] = (Headers *)&stack0xffffffffffffffd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"/v1/disk/resources?path=","");
  url_encode(&local_68,(YdiskRestClient *)this_00,utf8Path);
  std::__cxx11::string::_M_append((char *)local_38,(ulong)local_68._M_dataplus._M_p);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  this_01 = (Client *)local_48;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  httplib::Client::Put
            (this_01,(char *)this->http_client,local_38[0],(string *)&this->headers,
             (char *)&local_68);
  if (((Response *)local_48._0_8_ != (Response *)0x0) && (*(int *)(local_48._0_8_ + 0x20) == 0xc9))
  {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if (local_38[0] != (Headers *)&stack0xffffffffffffffd8) {
      operator_delete(local_38[0],local_28 + 1);
    }
    return;
  }
  throw_response_error((YdiskRestClient *)this_01,(Response *)local_48._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if (local_38[0] != (Headers *)&stack0xffffffffffffffd8) {
    operator_delete(local_38[0],local_28 + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void YdiskRestClient::makeFolder(std::string utf8Path)
{
    std::string url("/v1/disk/resources?path=");
    url += url_encode(utf8Path);
    std::string empty_body;
    auto r = http_client->Put(url.c_str(), headers, empty_body, "text/plain");

    if(!r.get() || r->status!=201)
        throw_response_error(r.get());
}